

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

shared_ptr<_IO_FILE> __thiscall
phosg::fopen_shared(phosg *this,string *filename,string *mode,FILE *dash_file)

{
  bool bVar1;
  FILE *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<_IO_FILE> sVar3;
  FILE *dash_file_local;
  string *mode_local;
  string *filename_local;
  
  if ((dash_file == (FILE *)0x0) || (bVar1 = ::std::operator==(filename,"-"), !bVar1)) {
    __p = fopen_binary_raw(filename,mode);
    ::std::shared_ptr<_IO_FILE>::shared_ptr<_IO_FILE,void(*)(_IO_FILE*),void>
              ((shared_ptr<_IO_FILE> *)this,__p,fclose_raw);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    ::std::shared_ptr<_IO_FILE>::
    shared_ptr<_IO_FILE,phosg::fopen_shared(std::__cxx11::string_const&,std::__cxx11::string_const&,_IO_FILE*)::__0,void>
              ((shared_ptr<_IO_FILE> *)this,dash_file);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<_IO_FILE>)sVar3.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<FILE> fopen_shared(const string& filename, const string& mode, FILE* dash_file) {
  if (dash_file && (filename == "-")) {
    return shared_ptr<FILE>(dash_file, [](FILE*) {});
  }
  return shared_ptr<FILE>(fopen_binary_raw(filename, mode), fclose_raw);
}